

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O0

Test * StringPieceUtilTestToLowerASCII::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x10);
  StringPieceUtilTestToLowerASCII((StringPieceUtilTestToLowerASCII *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST(StringPieceUtilTest, ToLowerASCII) {
  EXPECT_EQ('a', ToLowerASCII('A'));
  EXPECT_EQ('z', ToLowerASCII('Z'));
  EXPECT_EQ('a', ToLowerASCII('a'));
  EXPECT_EQ('z', ToLowerASCII('z'));
  EXPECT_EQ('/', ToLowerASCII('/'));
  EXPECT_EQ('1', ToLowerASCII('1'));
}